

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O1

bool __thiscall cmCTestP4::DiffParser::ProcessLine(DiffParser *this)

{
  char *pcVar1;
  bool bVar2;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20;
  undefined7 uStack_1f;
  
  if ((((this->super_LineParser).Line._M_string_length != 0) &&
      (pcVar1 = (this->super_LineParser).Line._M_dataplus._M_p, *pcVar1 == '=')) &&
     (bVar2 = cmsys::RegularExpression::find(&this->RegexDiff,pcVar1,&(this->RegexDiff).regmatch),
     bVar2)) {
    pcVar1 = (this->RegexDiff).regmatch.startp[1];
    if (pcVar1 == (char *)0x0) {
      local_30 = &local_20;
      local_28 = 0;
      local_20 = 0;
    }
    else {
      local_30 = &local_20;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_30,pcVar1,(this->RegexDiff).regmatch.endp[1]);
    }
    std::__cxx11::string::operator=((string *)&this->CurrentPath,(string *)&local_30);
    if (local_30 != &local_20) {
      operator_delete(local_30,CONCAT71(uStack_1f,local_20) + 1);
    }
    this->AlreadyNotified = false;
    return true;
  }
  if (this->AlreadyNotified == false) {
    (*(this->P4->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[10])
              (this->P4,1,&this->CurrentPath);
    this->AlreadyNotified = true;
  }
  return true;
}

Assistant:

bool ProcessLine() override
  {
    if (!this->Line.empty() && this->Line[0] == '=' &&
        this->RegexDiff.find(this->Line)) {
      this->CurrentPath = this->RegexDiff.match(1);
      this->AlreadyNotified = false;
    } else {
      if (!this->AlreadyNotified) {
        this->P4->DoModification(PathModified, this->CurrentPath);
        this->AlreadyNotified = true;
      }
    }
    return true;
  }